

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O2

ssize_t sf_parse_bare_item(nghttp2_sf_value *dest,uint8_t *begin,uint8_t *end)

{
  byte bVar1;
  uint8_t uVar2;
  ssize_t sVar3;
  byte *pbVar4;
  int iVar5;
  byte *pbVar6;
  byte *pbVar7;
  size_t sVar8;
  long lVar9;
  int iVar10;
  uint8_t *puVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  
  bVar1 = *begin;
  switch(bVar1) {
  case 0x22:
    pbVar4 = (byte *)0xffffffffffffffff;
    pbVar6 = begin + 1;
    for (pbVar7 = pbVar6; pbVar7 != end; pbVar7 = pbVar7 + 1) {
      bVar1 = *pbVar7;
      if (bVar1 == 0x5c) {
        pbVar7 = pbVar7 + 1;
        if (pbVar7 == end) {
          return -1;
        }
        if ((*pbVar7 != 0x22) && (*pbVar7 != 0x5c)) {
          return -1;
        }
      }
      else {
        if (bVar1 == 0x22) {
          if (dest != (nghttp2_sf_value *)0x0) {
            dest->type = '\x03';
            (dest->field_1).s.base = pbVar6;
            (dest->field_1).s.len = (long)pbVar7 - (long)pbVar6;
          }
          return (ssize_t)(pbVar7 + (1 - (long)begin));
        }
        if (SF_DQUOTE_CHARS[bVar1] == 0) {
          return -1;
        }
      }
    }
    break;
  default:
    if ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) goto switchD_004700d1_caseD_2a;
LAB_004701f6:
    pbVar4 = (byte *)0xffffffffffffffff;
    break;
  case 0x2a:
switchD_004700d1_caseD_2a:
    sVar3 = sf_parse_token(dest,begin,end);
    return sVar3;
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    if (bVar1 == 0x2d) {
      pbVar6 = begin + 1;
      if (pbVar6 == end) goto LAB_004701f6;
      bVar1 = *pbVar6;
      iVar5 = -1;
    }
    else {
      iVar5 = 1;
      pbVar6 = begin;
    }
    pbVar4 = (byte *)0xffffffffffffffff;
    if (0xf5 < (byte)(bVar1 - 0x3a)) {
      iVar10 = 1;
      lVar12 = 0;
      uVar14 = 0;
      uVar13 = 0;
      for (; pbVar4 = end, pbVar6 != end; pbVar6 = pbVar6 + 1) {
        bVar1 = *pbVar6;
        if (bVar1 - 0x30 < 10) {
          if (0xe < uVar14) {
            return -1;
          }
          lVar12 = lVar12 * 10 + (ulong)bVar1 + -0x30;
          uVar14 = uVar14 + 1;
        }
        else {
          pbVar4 = pbVar6;
          if (bVar1 != 0x2e) break;
          if (iVar10 != 1) goto LAB_00470194;
          iVar10 = 2;
          uVar13 = uVar14;
          if (0xc < uVar14) {
            return -1;
          }
        }
      }
      if (iVar10 == 1) {
        if (dest != (nghttp2_sf_value *)0x0) {
          dest->type = '\x01';
          (dest->field_1).i = lVar12 * iVar5;
        }
      }
      else {
LAB_00470194:
        lVar9 = uVar13 - uVar14;
        if (lVar9 == 0) {
          return -1;
        }
        if (3 < uVar14 - uVar13) {
          return -1;
        }
        if (dest != (nghttp2_sf_value *)0x0) {
          dest->type = '\x02';
          dVar15 = (double)lVar12;
          for (; lVar9 != 0; lVar9 = lVar9 + 1) {
            dVar15 = dVar15 / 10.0;
            (dest->field_1).d = dVar15;
          }
          (dest->field_1).d = dVar15 * (double)iVar5;
        }
      }
      pbVar4 = pbVar4 + -(long)begin;
    }
    break;
  case 0x3a:
    puVar11 = begin + 1;
    pbVar4 = (byte *)0xffffffffffffffff;
    for (sVar8 = 0; puVar11 + sVar8 != end; sVar8 = sVar8 + 1) {
      uVar13 = (ulong)puVar11[sVar8];
      if (uVar13 == 0x3a) {
        if (dest != (nghttp2_sf_value *)0x0) {
          dest->type = '\x05';
          (dest->field_1).s.base = puVar11;
          (dest->field_1).s.len = sVar8;
        }
        return sVar8 + 2;
      }
      if (SF_BYTESEQ_CHARS[uVar13] == 0) {
        return -1;
      }
    }
    break;
  case 0x3f:
    pbVar4 = (byte *)0xffffffffffffffff;
    if (begin + 1 != end) {
      uVar2 = begin[1];
      if (uVar2 == '0') {
        iVar5 = 0;
      }
      else {
        if (uVar2 != '1') {
          return -1;
        }
        iVar5 = 1;
      }
      pbVar4 = (byte *)0x2;
      if (dest != (nghttp2_sf_value *)0x0) {
        dest->type = '\0';
        (dest->field_1).b = iVar5;
      }
    }
  }
  return (ssize_t)pbVar4;
}

Assistant:

static ssize_t sf_parse_bare_item(nghttp2_sf_value *dest, const uint8_t *begin,
                                  const uint8_t *end) {
  switch (*begin) {
  case '-':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    return sf_parse_integer_or_decimal(dest, begin, end);
  case '"':
    return sf_parse_string(dest, begin, end);
  case '*':
    return sf_parse_token(dest, begin, end);
  case ':':
    return sf_parse_byteseq(dest, begin, end);
  case '?':
    return sf_parse_boolean(dest, begin, end);
  default:
    if (('A' <= *begin && *begin <= 'Z') || ('a' <= *begin && *begin <= 'z')) {
      return sf_parse_token(dest, begin, end);
    }
    return -1;
  }
}